

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

double __thiscall VCCluster::energyWithoutItem(VCCluster *this,VCFace *f)

{
  double dVar1;
  double dVar2;
  ResScalar RVar3;
  ResScalar RVar4;
  Vector3d zi;
  Vector3d ws;
  Vector3d *local_48;
  Vector3d *local_40;
  double local_38;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_28 [24];
  
  local_48 = &this->weightedSum;
  local_40 = &f->center;
  local_38 = f->area;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_28,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)&local_48);
  dVar1 = this->area - f->area;
  (*this->_vptr_VCCluster[7])(&local_48,this);
  dVar2 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    RVar3 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_48,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_48);
    RVar4 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_48,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_28);
    dVar2 = dVar1 * RVar3 - (RVar4 + RVar4);
  }
  return dVar2;
}

Assistant:

double VCCluster::energyWithoutItem(VCFace* f) {
	Vector3d ws = weightedSum - f->center * f->area;
	double a = area - f->area;
	Vector3d zi = center();
	return a == 0 ? ENG_NULL : a * zi.dot(zi) - 2 * zi.dot(ws);
}